

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

void __thiscall HighsSparseMatrix::ensureColwise(HighsSparseMatrix *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *__x;
  vector<double,_std::allocator<double>_> *__x_00;
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  int *piVar6;
  size_type sVar7;
  int iVar8;
  size_type sVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  size_type __n;
  vector<int,_std::allocator<int>_> Alength;
  vector<int,_std::allocator<int>_> ARindex;
  vector<int,_std::allocator<int>_> ARstart;
  vector<double,_std::allocator<double>_> ARvalue;
  value_type_conflict2 local_9c;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  if (this->format_ == kColwise) {
    return;
  }
  iVar8 = this->num_col_;
  __n = (size_type)iVar8;
  iVar1 = this->num_row_;
  this_00 = &this->start_;
  iVar10 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[iVar1];
  sVar9 = (size_type)iVar10;
  if (sVar9 == 0) {
    local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (this_00,__n + 1,(value_type_conflict2 *)&local_60);
    piVar3 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish != piVar3) {
      (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar3;
    }
    pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar5) {
      (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar5;
    }
    goto LAB_0037a280;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_60,this_00);
  __x = &this->index_;
  std::vector<int,_std::allocator<int>_>::vector(&local_78,__x);
  __x_00 = &this->value_;
  std::vector<double,_std::allocator<double>_>::vector(&local_48,__x_00);
  std::vector<int,_std::allocator<int>_>::resize(this_00,__n + 1);
  std::vector<int,_std::allocator<int>_>::resize(__x,sVar9);
  std::vector<double,_std::allocator<double>_>::resize(__x_00,sVar9);
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_9c = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_98,__n,&local_9c);
  piVar6 = (int *)CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_);
  sVar7 = (size_type)*piVar6;
  if (*piVar6 < iVar10) {
    do {
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[sVar7]] =
           local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar7]] + 1;
      sVar7 = sVar7 + 1;
    } while (sVar9 != sVar7);
  }
  piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  *piVar3 = 0;
  if (0 < iVar8) {
    iVar10 = 0;
    sVar9 = 0;
    do {
      iVar10 = iVar10 + local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[sVar9];
      piVar3[sVar9 + 1] = iVar10;
      sVar9 = sVar9 + 1;
    } while (__n != sVar9);
  }
  if (0 < iVar1) {
    piVar4 = (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar5 = (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar10 = *piVar6;
    lVar11 = 0;
    do {
      lVar12 = lVar11 + 1;
      iVar2 = piVar6[lVar11 + 1];
      if (iVar10 < piVar6[lVar11 + 1]) {
        lVar13 = (long)iVar10;
        do {
          iVar10 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar13];
          iVar2 = piVar3[iVar10];
          piVar4[iVar2] = (int)lVar11;
          pdVar5[iVar2] =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar13];
          piVar3[iVar10] = piVar3[iVar10] + 1;
          lVar13 = lVar13 + 1;
          iVar2 = piVar6[lVar12];
        } while (lVar13 < piVar6[lVar12]);
      }
      iVar10 = iVar2;
      lVar11 = lVar12;
    } while (lVar12 != iVar1);
  }
  *piVar3 = 0;
  if (iVar8 < 1) {
    if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) goto LAB_0037a24e;
  }
  else {
    iVar8 = 0;
    sVar9 = 0;
    do {
      iVar8 = iVar8 + local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[sVar9];
      piVar3[sVar9 + 1] = iVar8;
      sVar9 = sVar9 + 1;
    } while (__n != sVar9);
LAB_0037a24e:
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((void *)CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
LAB_0037a280:
  this->format_ = kColwise;
  return;
}

Assistant:

bool HighsSparseMatrix::isColwise() const {
  return this->format_ == MatrixFormat::kColwise;
}